

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void aom_paeth_predictor_16x16_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  ushort uVar3;
  __m256i *in_RCX;
  __m256i *in_RDX;
  uint8_t *in_RSI;
  uint8_t *above_00;
  uint8_t *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined1 auVar7 [16];
  __m128i row;
  __m256i l16;
  int i;
  __m256i top;
  __m256i one;
  __m256i rep;
  __m256i tl16;
  __m256i l;
  undefined8 local_2d0;
  undefined8 uStackY_2c8;
  int local_284;
  __m256i *left_00;
  undefined8 uStack_268;
  undefined1 local_240 [32];
  uint8_t *local_1c8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  above_00 = in_RSI;
  get_left_vector(in_RCX,in_RSI);
  uVar3 = (ushort)*(byte *)((long)in_RDX[-1] + 0x1f);
  auVar5 = vpinsrw_avx(ZEXT216(uVar3),(uint)uVar3,1);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar3,2);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar3,3);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar3,4);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar3,5);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar3,6);
  vpinsrw_avx(auVar5,(uint)uVar3,7);
  auVar5 = vpinsrw_avx(ZEXT216(uVar3),(uint)uVar3,1);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar3,2);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar3,3);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar3,4);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar3,5);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar3,6);
  vpinsrw_avx(auVar5,(uint)uVar3,7);
  auVar5 = vpinsrw_avx(ZEXT216(0x8000),0x8000,1);
  auVar5 = vpinsrw_avx(auVar5,0x8000,2);
  auVar5 = vpinsrw_avx(auVar5,0x8000,3);
  auVar5 = vpinsrw_avx(auVar5,0x8000,4);
  auVar5 = vpinsrw_avx(auVar5,0x8000,5);
  auVar5 = vpinsrw_avx(auVar5,0x8000,6);
  local_240._0_16_ = vpinsrw_avx(auVar5,0x8000,7);
  auVar5 = vpinsrw_avx(ZEXT216(0x8000),0x8000,1);
  auVar5 = vpinsrw_avx(auVar5,0x8000,2);
  auVar5 = vpinsrw_avx(auVar5,0x8000,3);
  auVar5 = vpinsrw_avx(auVar5,0x8000,4);
  auVar5 = vpinsrw_avx(auVar5,0x8000,5);
  auVar5 = vpinsrw_avx(auVar5,0x8000,6);
  auVar5 = vpinsrw_avx(auVar5,0x8000,7);
  uStack_b0 = auVar5._0_8_;
  uStack_a8 = auVar5._8_8_;
  local_240._16_8_ = uStack_b0;
  local_240._24_8_ = uStack_a8;
  auVar5 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar5 = vpinsrw_avx(auVar5,1,2);
  auVar5 = vpinsrw_avx(auVar5,1,3);
  auVar5 = vpinsrw_avx(auVar5,1,4);
  auVar5 = vpinsrw_avx(auVar5,1,5);
  auVar5 = vpinsrw_avx(auVar5,1,6);
  auVar5 = vpinsrw_avx(auVar5,1,7);
  auVar7 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar7 = vpinsrw_avx(auVar7,1,2);
  auVar7 = vpinsrw_avx(auVar7,1,3);
  auVar7 = vpinsrw_avx(auVar7,1,4);
  auVar7 = vpinsrw_avx(auVar7,1,5);
  auVar7 = vpinsrw_avx(auVar7,1,6);
  auVar7 = vpinsrw_avx(auVar7,1,7);
  auVar4 = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar7;
  auVar7 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar5;
  uStack_70 = auVar7._0_8_;
  uStack_68 = auVar7._8_8_;
  auVar5 = auVar4;
  get_top_vector(in_RDX,above_00);
  local_1c8 = in_RDI;
  for (local_284 = 0; uStack_268 = auVar7._8_8_, left_00 = auVar7._0_8_, local_284 < 0x10;
      local_284 = local_284 + 1) {
    auVar2._8_8_ = in_XMM0_Qb;
    auVar2._0_8_ = in_XMM0_Qa;
    auVar2._16_8_ = in_YMM0_H;
    auVar2._24_8_ = in_register_00001218;
    auVar1 = vpshufb_avx2(auVar2,local_240);
    auVar6 = auVar1._0_16_;
    paeth_16x1_pred(left_00,auVar5._8_8_,auVar5._0_8_);
    auVar7._8_8_ = uStack_268;
    auVar7._0_8_ = left_00;
    local_2d0 = auVar6._0_8_;
    uStackY_2c8 = auVar6._8_8_;
    *(undefined8 *)local_1c8 = local_2d0;
    *(undefined8 *)(local_1c8 + 8) = uStackY_2c8;
    local_1c8 = in_RSI + (long)local_1c8;
    auVar1._16_8_ = uStack_70;
    auVar1._0_16_ = auVar4;
    auVar1._24_8_ = uStack_68;
    local_240 = vpaddw_avx2(local_240,auVar1);
  }
  return;
}

Assistant:

void aom_paeth_predictor_16x16_avx2(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  const __m256i l = get_left_vector(left);
  const __m256i tl16 = _mm256_set1_epi16((int16_t)above[-1]);
  __m256i rep = _mm256_set1_epi16((short)0x8000);
  const __m256i one = _mm256_set1_epi16(1);
  const __m256i top = get_top_vector(above);

  int i;
  for (i = 0; i < 16; ++i) {
    const __m256i l16 = _mm256_shuffle_epi8(l, rep);
    const __m128i row = paeth_16x1_pred(&l16, &top, &tl16);

    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    rep = _mm256_add_epi16(rep, one);
  }
}